

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receptor.cpp
# Opt level: O1

void __thiscall indk::Neuron::Receptor::doUpdatePos(Receptor *this,Position *_RPos)

{
  Position **ppPVar1;
  float fVar2;
  
  if (this->Locked == true) {
    ppPVar1 = &this->PhantomPos;
    fVar2 = Position::getDistance(this->PhantomPos,_RPos);
    this->Lf = fVar2 + this->Lf;
  }
  else {
    fVar2 = Position::getDistance
                      ((this->ReferencePos).
                       super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[this->Scope],_RPos);
    this->L = fVar2 + this->L;
    ppPVar1 = (this->ReferencePos).
              super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>._M_impl.
              super__Vector_impl_data._M_start + this->Scope;
  }
  Position::doAdd(*ppPVar1,_RPos);
  return;
}

Assistant:

void indk::Neuron::Receptor::doUpdatePos(indk::Position *_RPos) {
    if (Locked) {
        Lf += indk::Position::getDistance(PhantomPos, _RPos);
        PhantomPos -> doAdd(_RPos);
    } else {
        L += indk::Position::getDistance(ReferencePos[Scope], _RPos);
        ReferencePos[Scope] -> doAdd(_RPos);
    }
}